

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall BasicBlock::InvertBranch(BasicBlock *this,BranchInstr *branch)

{
  code *pcVar1;
  bool bVar2;
  BranchInstr *pBVar3;
  undefined4 *puVar4;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  BranchInstr *branch_local;
  BasicBlock *this_local;
  
  pBVar3 = (BranchInstr *)GetLastInstr(this);
  if (pBVar3 != branch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x49c,"(this->GetLastInstr() == branch)","this->GetLastInstr() == branch");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = &GetSuccList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasTwo(pSVar5);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x49d,"(this->GetSuccList()->HasTwo())","this->GetSuccList()->HasTwo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IR::BranchInstr::Invert(branch);
  pSVar5 = &GetSuccList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Reverse(pSVar5);
  return;
}

Assistant:

void
BasicBlock::InvertBranch(IR::BranchInstr *branch)
{
    Assert(this->GetLastInstr() == branch);
    Assert(this->GetSuccList()->HasTwo());

    branch->Invert();
    this->GetSuccList()->Reverse();
}